

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O2

bool vera::loadPLY(string *_filename,Scene *_scene,bool _verbose)

{
  MaterialsMap *this;
  pointer pvVar1;
  vec<2,_float,_(glm::qualifier)0> vVar2;
  int iVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  Material *pMVar10;
  mapped_type *ppMVar11;
  ostream *poVar12;
  istream *piVar13;
  long lVar14;
  Model *this_00;
  mapped_type *ppMVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  vec<4,_float,_(glm::qualifier)0> vVar22;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  int local_600;
  int colorCompsFound;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vec3 n;
  undefined4 uStack_5cc;
  int local_5a4;
  float a;
  int normalsCoordsFound;
  vec3 v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  ulong local_560;
  ulong local_558;
  float b;
  float g;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string error;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  string line;
  string name;
  Mesh mesh;
  stringstream sline;
  string local_3b0 [368];
  fstream is;
  
  std::fstream::fstream(&is,(_filename->_M_dataplus)._M_p,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::__cxx11::string::string((string *)&sline,"default",(allocator *)&mesh);
    this = &_scene->materials;
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
            ::find(&this->_M_t,(key_type *)&sline);
    std::__cxx11::string::~string((string *)&sline);
    if ((_Rb_tree_header *)iVar9._M_node == &(_scene->materials)._M_t._M_impl.super__Rb_tree_header)
    {
      pMVar10 = (Material *)operator_new(0x150);
      std::__cxx11::string::string((string *)&sline,"default",(allocator *)&line);
      Material::Material(pMVar10,(string *)&sline);
      std::__cxx11::string::string((string *)&mesh,"default",(allocator *)&error);
      ppMVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](this,(key_type *)&mesh);
      *ppMVar11 = pMVar10;
      std::__cxx11::string::~string((string *)&mesh);
      std::__cxx11::string::~string((string *)&sline);
    }
    std::__cxx11::string::string((string *)&sline,"default",(allocator *)&mesh);
    ppMVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](this,(key_type *)&sline);
    pMVar10 = *ppMVar11;
    std::__cxx11::string::~string((string *)&sline);
    Mesh::Mesh(&mesh);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    colorCompsFound = 0;
    normalsCoordsFound = 0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    error.field_2._M_local_buf[0] = '\0';
    name.field_2._M_local_buf[0] = '\0';
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
    bVar6 = std::operator!=(&line,"ply");
    if (bVar6) {
      std::__cxx11::string::assign((char *)&error);
      iVar18 = 1;
LAB_002a3211:
      poVar12 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar18);
      poVar12 = std::operator<<(poVar12,":");
      poVar12 = std::operator<<(poVar12,(string *)&error);
      std::endl<char,std::char_traits<char>>(poVar12);
      poVar12 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): \"");
      poVar12 = std::operator<<(poVar12,(string *)&line);
      poVar12 = std::operator<<(poVar12,"\"");
      bVar6 = true;
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line)
      ;
      bVar6 = std::operator!=(&line,"format ascii 1.0");
      if (bVar6) {
        std::__cxx11::string::assign((char *)&error);
        iVar18 = 2;
        goto LAB_002a3211;
      }
      iVar19 = -1;
      iVar16 = 0;
      iVar18 = 3;
      iVar3 = 0;
      local_618 = 0;
      local_620 = 0;
      local_61c = 0;
      local_614 = 0;
      iVar17 = -1;
      local_5a4 = 0;
      local_600 = 0;
      local_558 = 0;
      local_560 = 0;
      bVar6 = false;
      bVar20 = 0;
      while( true ) {
        piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&is,(string *)&line);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        lVar14 = std::__cxx11::string::find((char *)&line,0x30100b);
        if (lVar14 == 0) goto LAB_002a3998;
        if (((bVar20 & 0xfd) == 0) &&
           (lVar14 = std::__cxx11::string::find((char *)&line,0x301013), lVar14 == 0)) {
          iVar19 = 0;
          if (0 < iVar17) {
            iVar19 = iVar17;
          }
          std::__cxx11::string::substr((ulong)&sline,(ulong)&line);
          iVar8 = toInt((string *)&sline);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::resize(&vertices,(long)iVar8);
          iVar19 = iVar19 + 1;
          std::__cxx11::string::~string((string *)&sline);
          goto LAB_002a3994;
        }
        if (bVar20 < 2) {
          lVar14 = std::__cxx11::string::find((char *)&line,0x301022);
          if (lVar14 == 0) {
            iVar17 = 0;
            if (0 < iVar19) {
              iVar17 = iVar19;
            }
            std::__cxx11::string::substr((ulong)&sline,(ulong)&line);
            iVar8 = toInt((string *)&sline);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&indices,(long)(iVar8 * 3));
            iVar17 = iVar17 + 1;
            std::__cxx11::string::~string((string *)&sline);
            bVar20 = 2;
            goto LAB_002a3998;
          }
          if (bVar20 != 1) goto LAB_002a36b3;
          lVar14 = std::__cxx11::string::find((char *)&line,0x30102f);
          if (((lVar14 == 0) ||
              (lVar14 = std::__cxx11::string::find((char *)&line,0x301040), lVar14 == 0)) ||
             (lVar14 = std::__cxx11::string::find((char *)&line,0x301051), lVar14 == 0)) {
            local_5a4 = local_5a4 + 1;
LAB_002a3994:
            bVar20 = 1;
          }
          else {
            lVar14 = std::__cxx11::string::find((char *)&line,0x301062);
            if (((lVar14 == 0) ||
                (lVar14 = std::__cxx11::string::find((char *)&line,0x301074), lVar14 == 0)) ||
               (lVar14 = std::__cxx11::string::find((char *)&line,0x301086), lVar14 == 0)) {
              local_614 = iVar16 + 1;
              normalsCoordsFound = local_614;
              iVar16 = local_614;
              if (local_614 != 3) goto LAB_002a3994;
              std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::resize(&normals,((long)vertices.
                                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vertices.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              local_614 = 3;
              iVar16 = 3;
              bVar20 = 1;
            }
            else {
              lVar14 = std::__cxx11::string::find((char *)&line,0x301098);
              if (((lVar14 != 0) &&
                  (lVar14 = std::__cxx11::string::find((char *)&line,0x3010a9), lVar14 != 0)) &&
                 ((lVar14 = std::__cxx11::string::find((char *)&line,0x3010ba), lVar14 != 0 &&
                  (lVar14 = std::__cxx11::string::find((char *)&line,0x3010cb), lVar14 != 0)))) {
                lVar14 = std::__cxx11::string::find((char *)&line,0x3010dc);
                if ((((lVar14 == 0) ||
                     (lVar14 = std::__cxx11::string::find((char *)&line,0x3010ef), lVar14 == 0)) ||
                    (lVar14 = std::__cxx11::string::find((char *)&line,0x301104), lVar14 == 0)) ||
                   (lVar14 = std::__cxx11::string::find((char *)&line,0x301118), lVar14 == 0)) {
                  local_620 = iVar3 + 1;
                  colorCompsFound = local_620;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&colors,((long)vertices.
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  bVar6 = false;
                  local_61c = local_620;
                  local_618 = local_620;
                  iVar3 = local_620;
                }
                else {
                  lVar14 = std::__cxx11::string::find((char *)&line,0x30112d);
                  if ((lVar14 == 0) ||
                     (lVar14 = std::__cxx11::string::find((char *)&line,0x30113e), lVar14 == 0)) {
                    std::
                    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ::resize(&texcoord,
                             ((long)vertices.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  }
                  else {
                    lVar14 = std::__cxx11::string::find((char *)&line,0x30114f);
                    if ((lVar14 != 0) &&
                       (lVar14 = std::__cxx11::string::find((char *)&line,0x301168), lVar14 != 0))
                    goto LAB_002a36b3;
                    std::
                    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ::resize(&texcoord,
                             ((long)vertices.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  }
                  local_600 = local_600 + 1;
                }
                goto LAB_002a3994;
              }
              local_620 = iVar3 + 1;
              bVar6 = true;
              colorCompsFound = local_620;
              std::
              vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
              ::resize(&colors,((long)vertices.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vertices.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              bVar20 = 1;
              local_61c = local_620;
              local_618 = local_620;
              iVar3 = local_620;
            }
          }
        }
        else {
          if (((bVar20 == 2) &&
              (lVar14 = std::__cxx11::string::find((char *)&line,0x301181), lVar14 != 0)) &&
             (bVar7 = std::operator!=(&line,"end_header"), bVar7)) {
            std::__cxx11::string::assign((char *)&error);
            goto LAB_002a3211;
          }
LAB_002a36b3:
          bVar7 = std::operator==(&line,"end_header");
          if (bVar7) {
            if (iVar3 - 5U < 0xfffffffe &&
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              toString<int>((string *)&v,&colorCompsFound);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n
                             ,
                             "data has color coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &v);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sline,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n," expecting 3 or 4");
            }
            else {
              if (iVar16 == 3 ||
                  normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                if (vertices.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    vertices.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  poVar12 = std::operator<<((ostream *)&std::cout,
                                            "ERROR glMesh, load(): mesh loaded from \"");
                  poVar12 = std::operator<<(poVar12,(string *)_filename);
                  poVar12 = std::operator<<(poVar12,"\" has no vertices");
                  std::endl<char,std::char_traits<char>>(poVar12);
                }
                if (iVar19 == -1) {
                  iVar19 = 9999;
                }
                if (iVar17 == -1) {
                  iVar17 = 9999;
                }
                bVar20 = (iVar17 <= iVar19) * '\x02' + 3;
                local_620 = iVar3;
                local_61c = iVar3;
                local_618 = iVar3;
                local_614 = iVar16;
                goto LAB_002a3998;
              }
              toString<int>((string *)&v,&normalsCoordsFound);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n
                             ,
                             "data has normal coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &v);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sline,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n," expecting 3");
            }
            std::__cxx11::string::operator=((string *)&error,(string *)&sline);
            std::__cxx11::string::~string((string *)&sline);
            std::__cxx11::string::~string((string *)&n);
            std::__cxx11::string::~string((string *)&v);
            goto LAB_002a3211;
          }
          if (bVar20 == 5) {
            if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar20 = 5;
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&sline);
              std::__cxx11::stringbuf::str(local_3b0);
              std::istream::operator>>((string *)&sline,(int *)&n);
              aVar4 = n.field_0;
              if (n.field_0 == (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3)
              {
                std::istream::operator>>(&sline,(int *)&v);
                lVar14 = (long)((int)local_560 * 3);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14) = v.field_0;
                std::istream::operator>>(&sline,(int *)&v);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14 + 1) = v.field_0;
                std::istream::operator>>(&sline,(int *)&v);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14 + 2) = v.field_0;
                local_560 = (ulong)((int)local_560 + 1);
                bVar20 = (iVar17 <= iVar19 ||
                         (ulong)((long)indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 !=
                         local_560) * '\x02' + 3;
              }
              else {
                std::__cxx11::string::assign((char *)&error);
                bVar20 = 5;
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&sline);
              if (aVar4 != (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3)
              goto LAB_002a3211;
            }
          }
          else if (bVar20 == 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)&sline);
            std::__cxx11::stringbuf::str(local_3b0);
            std::istream::_M_extract<float>((float *)&sline);
            std::istream::_M_extract<float>((float *)&sline);
            if (2 < local_5a4) {
              std::istream::_M_extract<float>((float *)&sline);
            }
            lVar14 = (long)(int)local_558;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].field_2 = v.field_2;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].field_0 = v.field_0;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].field_1 = v.field_1;
            if (0 < local_614) {
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_2 = n.field_2;
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_0 = n.field_0;
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].field_1 = n.field_1;
            }
            if (0 < local_61c) {
              if (bVar6) {
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                if (3 < local_618) {
                  std::istream::_M_extract<float>((float *)&sline);
                }
                pvVar1 = colors.
                         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14;
                pvVar1->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)n.field_0;
                pvVar1->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)n.field_1;
                pvVar1->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)n.field_2;
                pvVar1->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_5cc;
                local_620 = local_618;
                local_61c = local_620;
              }
              else {
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                if (3 < local_620) {
                  std::istream::_M_extract<float>((float *)&sline);
                }
                auVar21._4_4_ = g;
                auVar21._0_4_ = n.field_0;
                auVar21._12_4_ = 0x437f0000;
                auVar21._8_4_ = b;
                vVar22 = (vec<4,_float,_(glm::qualifier)0>)divps(auVar21,_DAT_002d7050);
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14] = vVar22;
                local_61c = local_620;
              }
            }
            if (0 < local_600) {
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              vVar2.field_1.y = n.field_1.y;
              vVar2.field_0.x = n.field_0.x;
              texcoord.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14] = vVar2;
            }
            local_558 = (ulong)((int)local_558 + 1);
            bVar20 = (iVar19 < iVar17 &&
                     ((long)vertices.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc == local_558) * '\x02' +
                     3;
            std::__cxx11::stringstream::~stringstream((stringstream *)&sline);
          }
        }
LAB_002a3998:
        iVar18 = iVar18 + 1;
      }
      std::fstream::close();
      Mesh::addColors(&mesh,&colors);
      Mesh::addVertices(&mesh,&vertices);
      Mesh::addTexCoords(&mesh,&texcoord);
      if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        mesh.m_drawMode = POINTS;
      }
      else {
        Mesh::addIndices(&mesh,&indices);
      }
      if (normals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          normals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        Mesh::computeNormals(&mesh);
      }
      else {
        Mesh::addNormals(&mesh,&normals);
      }
      Mesh::computeTangents(&mesh);
      ppMVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](this,&pMVar10->name);
      *ppMVar11 = pMVar10;
      std::__cxx11::string::assign((char *)&name);
      this_00 = (Model *)operator_new(0x2d8);
      Model::Model(this_00,&name,&mesh,pMVar10);
      ppMVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                 ::operator[](&_scene->models,&name);
      *ppMVar15 = this_00;
      bVar6 = false;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&texcoord.
                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&normals.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&vertices.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&colors.
                     super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   );
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&line);
    Mesh::~Mesh(&mesh);
    bVar7 = true;
    if (!bVar6) goto LAB_002a3344;
  }
  std::fstream::close();
  poVar12 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, can not load  ");
  poVar12 = std::operator<<(poVar12,(string *)_filename);
  std::endl<char,std::char_traits<char>>(poVar12);
  bVar7 = false;
LAB_002a3344:
  std::fstream::~fstream(&is);
  return bVar7;
}

Assistant:

bool loadPLY(const std::string& _filename, Scene* _scene, bool _verbose) {    
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* default_material = _scene->materials["default"];

        Mesh mesh;

        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        mesh.addColors(colors);
        mesh.addVertices(vertices);
        mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 ){
            mesh.addIndices( indices );
        }
        else {
            mesh.setDrawMode( POINTS );
        }
        
        if ( normals.size() > 0 ) {
            mesh.addNormals( normals );
        }
        else {
            mesh.computeNormals();
        }

        mesh.computeTangents();

        _scene->materials[default_material->name] = default_material;

        if (mesh.getDrawMode() == POINTS)
            name = "points";
        else if (mesh.getDrawMode() == LINES)
            name = "lines";
        else
            name = "mesh";
        _scene->models[name] = new Model(name, mesh, default_material);

        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}